

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonMaximumSuppressionValidator.cpp
# Opt level: O1

Result * CoreML::validate<(MLModelType)610>(Result *__return_storage_ptr__,Model *format)

{
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *this;
  char *pcVar1;
  uint32 uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  string *psVar4;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *pRVar5;
  Rep *pRVar6;
  uint64 uVar7;
  TypeUnion TVar8;
  TypeUnion TVar9;
  TypeUnion TVar10;
  TypeUnion TVar11;
  TypeUnion TVar12;
  uint uVar13;
  bool bVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  Type *pTVar19;
  Type *pTVar20;
  Type *pTVar21;
  FeatureType *pFVar22;
  ostream *poVar23;
  ArrayFeatureType *pAVar24;
  size_t sVar25;
  long *plVar26;
  ArrayFeatureType_EnumeratedShapes *pAVar27;
  Type *pTVar28;
  long lVar29;
  ulong *puVar30;
  ArrayFeatureType *pAVar31;
  ArrayFeatureType_EnumeratedShapes *pAVar32;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar33;
  byte bVar34;
  TypeUnion *pTVar35;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  *in_R8;
  int iVar36;
  RepeatedPtrFieldBase *this_00;
  RepeatedPtrField<CoreML::Specification::ArrayFeatureType_Shape> *this_01;
  uint uVar37;
  bool bVar38;
  bool bVar39;
  bool bVar40;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_00;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_01;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_02;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_03;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_04;
  Result result;
  stringstream ss;
  TypeUnion local_2c8;
  long local_2c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8;
  TypeUnion *local_2a8;
  TypeUnion local_2a0;
  TypeUnion local_298;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  uint local_278;
  byte local_271;
  TypeUnion local_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_268;
  TypeUnion local_260;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258;
  Type *local_248;
  uint local_240;
  int local_23c;
  int local_238;
  int local_234;
  ModelDescription *local_230;
  TypeUnion local_228;
  char *local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218 [7];
  ios_base local_1a8 [264];
  RepeatedPtrFieldBase *local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  Model *local_78;
  string local_70;
  TypeUnion local_50 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_230 = format->description_;
  if (local_230 == (ModelDescription *)0x0) {
    local_230 = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
  }
  if (format->_oneof_case_[0] == 0x262) {
    local_2a0 = format->Type_;
  }
  else {
    local_2a0.nonmaximumsuppression_ = Specification::NonMaximumSuppression::default_instance();
  }
  local_2a8 = (TypeUnion *)__return_storage_ptr__;
  Result::Result((Result *)&local_270);
  validateModelDescription((Result *)&local_228,local_230,format->specificationversion_);
  local_270 = local_228;
  std::__cxx11::string::operator=((string *)&local_268,(string *)&local_220);
  if (local_220 != local_218[0]._M_local_buf + 8) {
    operator_delete(local_220,local_218[0]._8_8_ + 1);
  }
  bVar14 = Result::good((Result *)&local_270);
  pTVar35 = local_2a8;
  if (!bVar14) goto LAB_005091b6;
  iVar36 = (local_230->input_).super_RepeatedPtrFieldBase.current_size_;
  bVar34 = 0 < iVar36;
  local_78 = format;
  if (iVar36 < 1) {
    local_238 = -1;
    local_234 = -1;
    local_23c = -1;
    local_248 = (Type *)CONCAT44(local_248._4_4_,0xffffffff);
    this_00 = &(local_230->input_).super_RepeatedPtrFieldBase;
  }
  else {
    iVar36 = 0;
    local_248 = (Type *)CONCAT44(local_248._4_4_,0xffffffff);
    local_23c = -1;
    local_234 = -1;
    local_238 = -1;
    local_a0 = &(local_230->input_).super_RepeatedPtrFieldBase;
    do {
      local_278 = CONCAT31(local_278._1_3_,bVar34);
      pTVar19 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                          (local_a0,iVar36);
      TVar12 = local_2a0;
      pbVar3 = (pTVar19->name_).ptr_;
      iVar15 = std::__cxx11::string::compare
                         ((string *)
                          ((ArenaStringPtr *)&(local_2a0.pipelineclassifier_)->pipeline_)->ptr_);
      iVar16 = (int)local_248;
      if (iVar15 == 0) {
        iVar16 = iVar36;
      }
      local_248 = (Type *)CONCAT44(local_248._4_4_,iVar16);
      iVar16 = std::__cxx11::string::compare
                         (*(string **)
                           &((TVar12.pipeline_)->models_).super_RepeatedPtrFieldBase.current_size_);
      if (iVar16 == 0) {
        local_23c = iVar36;
      }
      iVar17 = std::__cxx11::string::compare
                         ((string *)((TVar12.pipeline_)->models_).super_RepeatedPtrFieldBase.rep_);
      iVar18 = std::__cxx11::string::compare
                         ((string *)((TVar12.pipeline_)->names_).super_RepeatedPtrFieldBase.arena_);
      if (iVar17 == 0) {
        local_234 = iVar36;
      }
      if (iVar18 == 0) {
        local_238 = iVar36;
      }
      if ((((iVar15 != 0) && (iVar16 != 0)) && (iVar17 != 0)) && (iVar18 != 0)) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_2c8,"Input feature \'",pbVar3);
        this_00 = local_a0;
        plVar26 = (long *)std::__cxx11::string::append((char *)&local_2c8);
        paVar33 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar26 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar26 == paVar33) {
          local_218[0]._0_8_ = paVar33->_M_allocated_capacity;
          local_218[0]._8_8_ = plVar26[3];
          local_228.int64type_ = (Int64FeatureType *)local_218;
        }
        else {
          local_218[0]._0_8_ = paVar33->_M_allocated_capacity;
          local_228.int64type_ = (Int64FeatureType *)*plVar26;
        }
        local_220 = (char *)plVar26[1];
        *plVar26 = (long)paVar33;
        plVar26[1] = 0;
        *(undefined1 *)(plVar26 + 2) = 0;
        Result::Result((Result *)local_2a8,TOO_MANY_FEATURES_FOR_MODEL_TYPE,(string *)&local_228);
        if (local_228.int64type_ != (Int64FeatureType *)local_218) {
          operator_delete(local_228.int64type_,local_218[0]._M_allocated_capacity + 1);
        }
        bVar34 = (byte)local_278;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c8.int64type_ != &local_2b8) {
          operator_delete(local_2c8.int64type_,local_2b8._M_allocated_capacity + 1);
        }
        break;
      }
      iVar36 = iVar36 + 1;
      iVar16 = (local_230->input_).super_RepeatedPtrFieldBase.current_size_;
      bVar34 = iVar36 < iVar16;
      this_00 = local_a0;
    } while (iVar36 < iVar16);
  }
  pTVar35 = local_2a8;
  if ((bVar34 & 1) != 0) goto LAB_00509206;
  if ((int)local_248 == -1) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2c8,
                   "Expected feature \'",
                   ((ArenaStringPtr *)&(local_2a0.pipelineclassifier_)->pipeline_)->ptr_);
    plVar26 = (long *)std::__cxx11::string::append((char *)&local_2c8);
    local_228.int64type_ = (Int64FeatureType *)local_218;
    paVar33 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar26 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar26 == paVar33) {
      local_218[0]._0_8_ = paVar33->_M_allocated_capacity;
      local_218[0]._8_8_ = plVar26[3];
    }
    else {
      local_218[0]._0_8_ = paVar33->_M_allocated_capacity;
      local_228.int64type_ = (Int64FeatureType *)*plVar26;
    }
    local_220 = (char *)plVar26[1];
    *plVar26 = (long)paVar33;
    plVar26[1] = 0;
    *(undefined1 *)(plVar26 + 2) = 0;
    Result::Result((Result *)pTVar35,INTERFACE_FEATURE_NAME_MISMATCH,(string *)&local_228);
LAB_00509350:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228.int64type_ != local_218) {
      operator_delete(local_228.int64type_,local_218[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8.int64type_ == &local_2b8) goto LAB_00509206;
  }
  else {
    if (local_23c == -1) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2c8
                     ,"Expected feature \'",
                     *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      &((local_2a0.pipeline_)->models_).super_RepeatedPtrFieldBase.current_size_);
      plVar26 = (long *)std::__cxx11::string::append((char *)&local_2c8);
      local_228.int64type_ = (Int64FeatureType *)local_218;
      paVar33 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar26 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar26 == paVar33) {
        local_218[0]._0_8_ = paVar33->_M_allocated_capacity;
        local_218[0]._8_8_ = plVar26[3];
      }
      else {
        local_218[0]._0_8_ = paVar33->_M_allocated_capacity;
        local_228.int64type_ = (Int64FeatureType *)*plVar26;
      }
      local_220 = (char *)plVar26[1];
      *plVar26 = (long)paVar33;
      plVar26[1] = 0;
      *(undefined1 *)(plVar26 + 2) = 0;
      Result::Result((Result *)pTVar35,INTERFACE_FEATURE_NAME_MISMATCH,(string *)&local_228);
      goto LAB_00509350;
    }
    this = &local_230->output_;
    iVar36 = (local_230->output_).super_RepeatedPtrFieldBase.current_size_;
    bVar34 = 0 < iVar36;
    if (iVar36 < 1) {
      local_240 = 0xffffffff;
      local_278 = 0xffffffff;
    }
    else {
      uVar37 = 0;
      local_278 = 0xffffffff;
      local_240 = 0xffffffff;
      do {
        local_271 = bVar34;
        pTVar19 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                            (&this->super_RepeatedPtrFieldBase,uVar37);
        TVar12 = local_2a0;
        pbVar3 = (pTVar19->name_).ptr_;
        iVar36 = std::__cxx11::string::compare
                           (*(string **)
                             &((local_2a0.pipeline_)->names_).super_RepeatedPtrFieldBase.
                              current_size_);
        iVar16 = std::__cxx11::string::compare
                           ((string *)((TVar12.pipeline_)->names_).super_RepeatedPtrFieldBase.rep_);
        if (iVar16 == 0) {
          local_240 = uVar37;
        }
        uVar13 = uVar37;
        if ((iVar36 != 0) && (uVar13 = local_278, iVar16 != 0)) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_2c8,"Output feature \'",pbVar3);
          pTVar35 = local_2a8;
          plVar26 = (long *)std::__cxx11::string::append((char *)&local_2c8);
          paVar33 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar26 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar26 == paVar33) {
            local_218[0]._0_8_ = paVar33->_M_allocated_capacity;
            local_218[0]._8_8_ = plVar26[3];
            local_228.int64type_ = (Int64FeatureType *)local_218;
          }
          else {
            local_218[0]._0_8_ = paVar33->_M_allocated_capacity;
            local_228.int64type_ = (Int64FeatureType *)*plVar26;
          }
          local_220 = (char *)plVar26[1];
          *plVar26 = (long)paVar33;
          plVar26[1] = 0;
          *(undefined1 *)(plVar26 + 2) = 0;
          Result::Result((Result *)pTVar35,TOO_MANY_FEATURES_FOR_MODEL_TYPE,(string *)&local_228);
          if (local_228.int64type_ != (Int64FeatureType *)local_218) {
            operator_delete(local_228.int64type_,local_218[0]._M_allocated_capacity + 1);
          }
          bVar34 = local_271;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c8.int64type_ != &local_2b8) {
            operator_delete(local_2c8.int64type_,local_2b8._M_allocated_capacity + 1);
          }
          break;
        }
        local_278 = uVar13;
        uVar37 = uVar37 + 1;
        iVar36 = (local_230->output_).super_RepeatedPtrFieldBase.current_size_;
        bVar34 = (int)uVar37 < iVar36;
        pTVar35 = local_2a8;
      } while ((int)uVar37 < iVar36);
    }
    if ((bVar34 & 1) != 0) goto LAB_00509206;
    if (local_278 == 0xffffffff) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2c8
                     ,"Expected feature \'",
                     *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      &((local_2a0.pipeline_)->names_).super_RepeatedPtrFieldBase.current_size_);
      plVar26 = (long *)std::__cxx11::string::append((char *)&local_2c8);
      local_228.int64type_ = (Int64FeatureType *)local_218;
      paVar33 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar26 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar26 == paVar33) {
        local_218[0]._0_8_ = paVar33->_M_allocated_capacity;
        local_218[0]._8_8_ = plVar26[3];
      }
      else {
        local_218[0]._0_8_ = paVar33->_M_allocated_capacity;
        local_228.int64type_ = (Int64FeatureType *)*plVar26;
      }
      local_220 = (char *)plVar26[1];
      *plVar26 = (long)paVar33;
      plVar26[1] = 0;
      *(undefined1 *)(plVar26 + 2) = 0;
      Result::Result((Result *)pTVar35,INTERFACE_FEATURE_NAME_MISMATCH,(string *)&local_228);
      goto LAB_00509350;
    }
    if (local_240 == 0xffffffff) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2c8
                     ,"Expected feature \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((local_2a0.pipeline_)->names_).super_RepeatedPtrFieldBase.rep_);
      plVar26 = (long *)std::__cxx11::string::append((char *)&local_2c8);
      local_228.int64type_ = (Int64FeatureType *)local_218;
      paVar33 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar26 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar26 == paVar33) {
        local_218[0]._0_8_ = paVar33->_M_allocated_capacity;
        local_218[0]._8_8_ = plVar26[3];
      }
      else {
        local_218[0]._0_8_ = paVar33->_M_allocated_capacity;
        local_228.int64type_ = (Int64FeatureType *)*plVar26;
      }
      local_220 = (char *)plVar26[1];
      *plVar26 = (long)paVar33;
      plVar26[1] = 0;
      *(undefined1 *)(plVar26 + 2) = 0;
      Result::Result((Result *)pTVar35,INTERFACE_FEATURE_NAME_MISMATCH,(string *)&local_228);
      goto LAB_00509350;
    }
    psVar4 = ((ArenaStringPtr *)&(local_2a0.pipelineclassifier_)->pipeline_)->ptr_;
    local_298._0_4_ = 5;
    __l._M_len = 1;
    __l._M_array = (iterator)&local_298;
    std::
    vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
              *)&local_2c8,__l,(allocator_type *)&local_98);
    validateDescriptionsContainFeatureWithNameAndType<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
              ((Result *)&local_228,(CoreML *)this_00,
               (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)psVar4,
               (string *)&local_2c8,in_R8);
    pcVar1 = local_218[0]._M_local_buf + 8;
    local_270.int64type_ = local_228.int64type_;
    std::__cxx11::string::operator=((string *)&local_268,(string *)&local_220);
    if (local_220 != pcVar1) {
      operator_delete(local_220,local_218[0]._8_8_ + 1);
    }
    pTVar35 = local_2a8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8.int64type_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_2c8.int64type_,local_2b8._M_allocated_capacity - (long)local_2c8);
    }
    bVar14 = Result::good((Result *)&local_270);
    if (!bVar14) {
LAB_005091b6:
      *pTVar35 = local_270;
      pTVar35[1].int64type_ = (Int64FeatureType *)(pTVar35 + 3);
      if (local_268 == &local_258) {
        TVar9._1_7_ = local_258._M_allocated_capacity._1_7_;
        TVar9._0_1_ = local_258._M_local_buf[0];
        pTVar35[3] = TVar9;
        pTVar35[4] = (TypeUnion)local_258._8_8_;
      }
      else {
        pTVar35[1].int64type_ = (Int64FeatureType *)local_268;
        TVar8._1_7_ = local_258._M_allocated_capacity._1_7_;
        TVar8._0_1_ = local_258._M_local_buf[0];
        pTVar35[3] = TVar8;
      }
LAB_005091ef:
      local_268 = &local_258;
      pTVar35[2] = local_260;
      local_260.int64type_ = (Int64FeatureType *)0x0;
      local_258._M_local_buf[0] = '\0';
      goto LAB_00509206;
    }
    pRVar5 = *(RepeatedPtrField<CoreML::Specification::FeatureDescription> **)
              &((local_2a0.pipeline_)->models_).super_RepeatedPtrFieldBase.current_size_;
    local_298._0_4_ = 5;
    __l_00._M_len = 1;
    __l_00._M_array = (iterator)&local_298;
    std::
    vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
              *)&local_2c8,__l_00,(allocator_type *)&local_98);
    validateDescriptionsContainFeatureWithNameAndType<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
              ((Result *)&local_228,(CoreML *)this_00,pRVar5,(string *)&local_2c8,in_R8);
    local_270 = local_228;
    std::__cxx11::string::operator=((string *)&local_268,(string *)&local_220);
    if (local_220 != pcVar1) {
      operator_delete(local_220,local_218[0]._8_8_ + 1);
    }
    pTVar35 = local_2a8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8.int64type_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_2c8.int64type_,local_2b8._M_allocated_capacity - (long)local_2c8);
    }
    bVar14 = Result::good((Result *)&local_270);
    if (!bVar14) goto LAB_005091b6;
    if (-1 < local_234) {
      pRVar6 = ((local_2a0.pipeline_)->models_).super_RepeatedPtrFieldBase.rep_;
      local_298._0_4_ = 2;
      __l_01._M_len = 1;
      __l_01._M_array = (iterator)&local_298;
      std::
      vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
      ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                *)&local_2c8,__l_01,(allocator_type *)&local_98);
      validateDescriptionsContainFeatureWithNameAndType<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
                ((Result *)&local_228,(CoreML *)this_00,
                 (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)pRVar6,
                 (string *)&local_2c8,in_R8);
      local_270 = local_228;
      std::__cxx11::string::operator=((string *)&local_268,(string *)&local_220);
      if (local_220 != pcVar1) {
        operator_delete(local_220,local_218[0]._8_8_ + 1);
      }
      pTVar35 = local_2a8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8.int64type_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_2c8.int64type_,local_2b8._M_allocated_capacity - (long)local_2c8);
      }
      bVar14 = Result::good((Result *)&local_270);
      if (!bVar14) goto LAB_005091b6;
    }
    if (-1 < local_238) {
      psVar4 = (string *)((local_2a0.pipeline_)->names_).super_RepeatedPtrFieldBase.arena_;
      local_298._0_4_ = 2;
      __l_02._M_len = 1;
      __l_02._M_array = (iterator)&local_298;
      std::
      vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
      ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                *)&local_2c8,__l_02,(allocator_type *)&local_98);
      validateDescriptionsContainFeatureWithNameAndType<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
                ((Result *)&local_228,(CoreML *)this_00,
                 (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)psVar4,
                 (string *)&local_2c8,in_R8);
      local_270 = local_228;
      std::__cxx11::string::operator=((string *)&local_268,(string *)&local_220);
      if (local_220 != pcVar1) {
        operator_delete(local_220,local_218[0]._8_8_ + 1);
      }
      pTVar35 = local_2a8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8.int64type_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_2c8.int64type_,local_2b8._M_allocated_capacity - (long)local_2c8);
      }
      bVar14 = Result::good((Result *)&local_270);
      if (!bVar14) goto LAB_005091b6;
    }
    pRVar5 = *(RepeatedPtrField<CoreML::Specification::FeatureDescription> **)
              &((local_2a0.pipeline_)->names_).super_RepeatedPtrFieldBase.current_size_;
    local_298._0_4_ = 5;
    __l_03._M_len = 1;
    __l_03._M_array = (iterator)&local_298;
    std::
    vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
              *)&local_2c8,__l_03,(allocator_type *)&local_98);
    validateDescriptionsContainFeatureWithNameAndType<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
              ((Result *)&local_228,(CoreML *)this,pRVar5,(string *)&local_2c8,in_R8);
    local_270 = local_228;
    std::__cxx11::string::operator=((string *)&local_268,(string *)&local_220);
    if (local_220 != pcVar1) {
      operator_delete(local_220,local_218[0]._8_8_ + 1);
    }
    pTVar35 = local_2a8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8.int64type_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_2c8.int64type_,local_2b8._M_allocated_capacity - (long)local_2c8);
    }
    bVar14 = Result::good((Result *)&local_270);
    if (!bVar14) goto LAB_005091b6;
    pRVar6 = ((local_2a0.pipeline_)->names_).super_RepeatedPtrFieldBase.rep_;
    local_298._0_4_ = 5;
    __l_04._M_len = 1;
    __l_04._M_array = (iterator)&local_298;
    std::
    vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
              *)&local_2c8,__l_04,(allocator_type *)&local_98);
    validateDescriptionsContainFeatureWithNameAndType<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
              ((Result *)&local_228,(CoreML *)this,
               (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)pRVar6,
               (string *)&local_2c8,in_R8);
    local_270 = local_228;
    std::__cxx11::string::operator=((string *)&local_268,(string *)&local_220);
    if (local_220 != pcVar1) {
      operator_delete(local_220,local_218[0]._8_8_ + 1);
    }
    pTVar35 = local_2a8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8.int64type_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_2c8.int64type_,local_2b8._M_allocated_capacity - (long)local_2c8);
    }
    bVar14 = Result::good((Result *)&local_270);
    if (!bVar14) goto LAB_005091b6;
    if ((0.0 <= (local_2a0.nonmaximumsuppression_)->iouthreshold_) &&
       ((local_2a0.nonmaximumsuppression_)->iouthreshold_ <= 1.0)) {
      if ((local_2a0.nonmaximumsuppression_)->confidencethreshold_ < 0.0) {
        local_228.int64type_ = (Int64FeatureType *)local_218;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_228,
                   "confidenceThreshold must be a non-negative value. If you do not want to eliminate any predictions based on confidence, set it to 0.0."
                   ,"");
        Result::Result((Result *)pTVar35,INVALID_MODEL_PARAMETERS,(string *)&local_228);
        goto LAB_005093cd;
      }
      pTVar19 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                          (this_00,(int)local_248);
      pTVar20 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                          (this_00,local_23c);
      pTVar21 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                          (&this->super_RepeatedPtrFieldBase,local_278);
      pAVar31 = (ArrayFeatureType *)(ulong)local_240;
      local_248 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                            (&this->super_RepeatedPtrFieldBase,local_240);
      pFVar22 = pTVar19->type_;
      if (pFVar22 == (FeatureType *)0x0) {
        pFVar22 = (FeatureType *)&Specification::_FeatureType_default_instance_;
      }
      if (pFVar22->_oneof_case_[0] == 5) {
        pAVar24 = (pFVar22->Type_).multiarraytype_;
      }
      else {
        pAVar24 = Specification::ArrayFeatureType::default_instance();
      }
      pFVar22 = pTVar21->type_;
      if (pFVar22 == (FeatureType *)0x0) {
        pFVar22 = (FeatureType *)&Specification::_FeatureType_default_instance_;
      }
      iVar36 = pAVar24->datatype_;
      if (pFVar22->_oneof_case_[0] == 5) {
        pAVar24 = (pFVar22->Type_).multiarraytype_;
      }
      else {
        pAVar24 = Specification::ArrayFeatureType::default_instance();
      }
      pFVar22 = pTVar20->type_;
      if (pFVar22 == (FeatureType *)0x0) {
        pFVar22 = (FeatureType *)&Specification::_FeatureType_default_instance_;
      }
      iVar16 = pAVar24->datatype_;
      if (pFVar22->_oneof_case_[0] == 5) {
        pAVar24 = (pFVar22->Type_).multiarraytype_;
      }
      else {
        pAVar24 = Specification::ArrayFeatureType::default_instance();
      }
      pFVar22 = local_248->type_;
      if (pFVar22 == (FeatureType *)0x0) {
        pFVar22 = (FeatureType *)&Specification::_FeatureType_default_instance_;
      }
      iVar15 = pAVar24->datatype_;
      if (pFVar22->_oneof_case_[0] == 5) {
        pAVar24 = (pFVar22->Type_).multiarraytype_;
      }
      else {
        pAVar24 = Specification::ArrayFeatureType::default_instance();
      }
      if (((iVar36 != iVar16) || (iVar36 != iVar15)) || (iVar36 != pAVar24->datatype_)) {
        std::__cxx11::stringstream::stringstream((stringstream *)&local_228);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218[0]._M_local_buf,
                   "\'confidence\' and \'coordinates\' must use a same element type, but ",0x41);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218[0]._M_local_buf,"\'input confidence\' is ",0x16);
        pFVar22 = pTVar19->type_;
        if (pFVar22 == (FeatureType *)0x0) {
          pFVar22 = (FeatureType *)&Specification::_FeatureType_default_instance_;
        }
        FeatureType::FeatureType((FeatureType *)&local_298,pFVar22);
        FeatureType::toString_abi_cxx11_((string *)&local_2c8,(FeatureType *)&local_298);
        poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_218[0]._M_local_buf,(char *)local_2c8.int64type_,
                             local_2c0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar23,", ",2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c8.int64type_ != &local_2b8) {
          operator_delete(local_2c8.int64type_,local_2b8._M_allocated_capacity + 1);
        }
        if (local_290 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_290);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218[0]._M_local_buf,"\'output confidence\' is ",0x17);
        pFVar22 = pTVar21->type_;
        if (pFVar22 == (FeatureType *)0x0) {
          pFVar22 = (FeatureType *)&Specification::_FeatureType_default_instance_;
        }
        FeatureType::FeatureType((FeatureType *)&local_298,pFVar22);
        FeatureType::toString_abi_cxx11_((string *)&local_2c8,(FeatureType *)&local_298);
        poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_218[0]._M_local_buf,(char *)local_2c8.int64type_,
                             local_2c0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar23,", ",2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c8.int64type_ != &local_2b8) {
          operator_delete(local_2c8.int64type_,local_2b8._M_allocated_capacity + 1);
        }
        if (local_290 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_290);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218[0]._M_local_buf,"\'input coordinates\' are ",0x18);
        pFVar22 = pTVar20->type_;
        if (pFVar22 == (FeatureType *)0x0) {
          pFVar22 = (FeatureType *)&Specification::_FeatureType_default_instance_;
        }
        FeatureType::FeatureType((FeatureType *)&local_298,pFVar22);
        FeatureType::toString_abi_cxx11_((string *)&local_2c8,(FeatureType *)&local_298);
        poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_218[0]._M_local_buf,(char *)local_2c8.int64type_,
                             local_2c0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar23,", ",2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c8.int64type_ != &local_2b8) {
          operator_delete(local_2c8.int64type_,local_2b8._M_allocated_capacity + 1);
        }
        if (local_290 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_290);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218[0]._M_local_buf,"and \'output coordinates\' are ",0x1d);
        pFVar22 = local_248->type_;
        if (pFVar22 == (FeatureType *)0x0) {
          pFVar22 = (FeatureType *)&Specification::_FeatureType_default_instance_;
        }
        FeatureType::FeatureType((FeatureType *)&local_298,pFVar22);
        FeatureType::toString_abi_cxx11_((string *)&local_2c8,(FeatureType *)&local_298);
        poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_218[0]._M_local_buf,(char *)local_2c8.int64type_,
                             local_2c0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar23,".",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c8.int64type_ != &local_2b8) {
          operator_delete(local_2c8.int64type_,local_2b8._M_allocated_capacity + 1);
        }
        if (local_290 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_290);
        }
        std::__cxx11::stringbuf::str();
        Result::Result((Result *)local_2a8,INVALID_MODEL_PARAMETERS,(string *)&local_2c8);
LAB_005099eb:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c8.int64type_ != &local_2b8) {
          operator_delete(local_2c8.int64type_,local_2b8._M_allocated_capacity + 1);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)&local_228);
        std::ios_base::~ios_base(local_1a8);
        pTVar35 = local_2a8;
        goto LAB_00509206;
      }
      if (local_78->specificationversion_ < 5) {
        if (iVar36 != 0x10040) {
          std::__cxx11::stringstream::stringstream((stringstream *)&local_228);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218[0]._M_local_buf,
                     "The element data type of \'confidence\' and \'coordinates\' must be MultiArray<DOUBLE> for model specification version earlier than "
                     ,0x80);
          poVar23 = (ostream *)std::ostream::operator<<((ostream *)local_218[0]._M_local_buf,5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar23,", but ",6);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218[0]._M_local_buf,"\'input confidence\' is ",0x16);
          pFVar22 = pTVar19->type_;
          if (pFVar22 == (FeatureType *)0x0) {
            pFVar22 = (FeatureType *)&Specification::_FeatureType_default_instance_;
          }
          FeatureType::FeatureType((FeatureType *)&local_298,pFVar22);
          FeatureType::toString_abi_cxx11_((string *)&local_2c8,(FeatureType *)&local_298);
          poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_218[0]._M_local_buf,(char *)local_2c8.int64type_,
                               local_2c0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar23,", ",2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c8.int64type_ != &local_2b8) {
            operator_delete(local_2c8.int64type_,local_2b8._M_allocated_capacity + 1);
          }
          if (local_290 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_290);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218[0]._M_local_buf,"\'output confidence\' is ",0x17);
          pFVar22 = pTVar21->type_;
          if (pFVar22 == (FeatureType *)0x0) {
            pFVar22 = (FeatureType *)&Specification::_FeatureType_default_instance_;
          }
          FeatureType::FeatureType((FeatureType *)&local_298,pFVar22);
          FeatureType::toString_abi_cxx11_((string *)&local_2c8,(FeatureType *)&local_298);
          poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_218[0]._M_local_buf,(char *)local_2c8.int64type_,
                               local_2c0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar23,", ",2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c8.int64type_ != &local_2b8) {
            operator_delete(local_2c8.int64type_,local_2b8._M_allocated_capacity + 1);
          }
          if (local_290 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_290);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218[0]._M_local_buf,"\'input coordinates\' are ",0x18);
          pFVar22 = pTVar20->type_;
          if (pFVar22 == (FeatureType *)0x0) {
            pFVar22 = (FeatureType *)&Specification::_FeatureType_default_instance_;
          }
          FeatureType::FeatureType((FeatureType *)&local_298,pFVar22);
          FeatureType::toString_abi_cxx11_((string *)&local_2c8,(FeatureType *)&local_298);
          poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_218[0]._M_local_buf,(char *)local_2c8.int64type_,
                               local_2c0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar23,", ",2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c8.int64type_ != &local_2b8) {
            operator_delete(local_2c8.int64type_,local_2b8._M_allocated_capacity + 1);
          }
          if (local_290 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_290);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218[0]._M_local_buf,"and \'output coordinates\' are ",0x1d);
          pFVar22 = local_248->type_;
          if (pFVar22 == (FeatureType *)0x0) {
            pFVar22 = (FeatureType *)&Specification::_FeatureType_default_instance_;
          }
          FeatureType::FeatureType((FeatureType *)&local_298,pFVar22);
          FeatureType::toString_abi_cxx11_((string *)&local_2c8,(FeatureType *)&local_298);
          poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_218[0]._M_local_buf,(char *)local_2c8.int64type_,
                               local_2c0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar23,". ",2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c8.int64type_ != &local_2b8) {
            operator_delete(local_2c8.int64type_,local_2b8._M_allocated_capacity + 1);
          }
          if (local_290 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_290);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218[0]._M_local_buf,
                     "To enable MultiArray<FLOAT32>, use the model specification version ",0x43);
          poVar23 = (ostream *)std::ostream::operator<<((ostream *)local_218[0]._M_local_buf,5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar23," or later.",10);
          std::__cxx11::stringbuf::str();
          Result::Result((Result *)local_2a8,INVALID_MODEL_PARAMETERS,(string *)&local_2c8);
          goto LAB_005099eb;
        }
      }
      else if ((iVar36 != 0x10020) && (iVar36 != 0x10040)) {
        std::__cxx11::stringstream::stringstream((stringstream *)&local_228);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218[0]._M_local_buf,
                   "The element data type of \'confidence\' and \'coordinates\' must be either MultiArray<DOUBLE> or MultiArray<FLOAT32>, but "
                   ,0x76);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218[0]._M_local_buf,"\'input confidence\' is ",0x16);
        pFVar22 = pTVar19->type_;
        if (pFVar22 == (FeatureType *)0x0) {
          pFVar22 = (FeatureType *)&Specification::_FeatureType_default_instance_;
        }
        FeatureType::FeatureType((FeatureType *)&local_298,pFVar22);
        FeatureType::toString_abi_cxx11_((string *)&local_2c8,(FeatureType *)&local_298);
        poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_218[0]._M_local_buf,(char *)local_2c8.int64type_,
                             local_2c0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar23,", ",2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c8.int64type_ != &local_2b8) {
          operator_delete(local_2c8.int64type_,local_2b8._M_allocated_capacity + 1);
        }
        if (local_290 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_290);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218[0]._M_local_buf,"\'output confidence\' is ",0x17);
        pFVar22 = pTVar21->type_;
        if (pFVar22 == (FeatureType *)0x0) {
          pFVar22 = (FeatureType *)&Specification::_FeatureType_default_instance_;
        }
        FeatureType::FeatureType((FeatureType *)&local_298,pFVar22);
        FeatureType::toString_abi_cxx11_((string *)&local_2c8,(FeatureType *)&local_298);
        poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_218[0]._M_local_buf,(char *)local_2c8.int64type_,
                             local_2c0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar23,", ",2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c8.int64type_ != &local_2b8) {
          operator_delete(local_2c8.int64type_,local_2b8._M_allocated_capacity + 1);
        }
        if (local_290 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_290);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218[0]._M_local_buf,"\'input coordinates\' are ",0x18);
        pFVar22 = pTVar20->type_;
        if (pFVar22 == (FeatureType *)0x0) {
          pFVar22 = (FeatureType *)&Specification::_FeatureType_default_instance_;
        }
        FeatureType::FeatureType((FeatureType *)&local_298,pFVar22);
        FeatureType::toString_abi_cxx11_((string *)&local_2c8,(FeatureType *)&local_298);
        poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_218[0]._M_local_buf,(char *)local_2c8.int64type_,
                             local_2c0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar23,", ",2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c8.int64type_ != &local_2b8) {
          operator_delete(local_2c8.int64type_,local_2b8._M_allocated_capacity + 1);
        }
        if (local_290 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_290);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218[0]._M_local_buf,"and \'output coordinates\' are ",0x1d);
        pFVar22 = local_248->type_;
        if (pFVar22 == (FeatureType *)0x0) {
          pFVar22 = (FeatureType *)&Specification::_FeatureType_default_instance_;
        }
        FeatureType::FeatureType((FeatureType *)&local_298,pFVar22);
        FeatureType::toString_abi_cxx11_((string *)&local_2c8,(FeatureType *)&local_298);
        poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_218[0]._M_local_buf,(char *)local_2c8.int64type_,
                             local_2c0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar23,".",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c8.int64type_ != &local_2b8) {
          operator_delete(local_2c8.int64type_,local_2b8._M_allocated_capacity + 1);
        }
        if (local_290 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_290);
        }
        std::__cxx11::stringbuf::str();
        Result::Result((Result *)local_2a8,INVALID_MODEL_PARAMETERS,(string *)&local_2c8);
        goto LAB_005099eb;
      }
      pFVar22 = pTVar21->type_;
      if (pFVar22 == (FeatureType *)0x0) {
        pFVar22 = (FeatureType *)&Specification::_FeatureType_default_instance_;
      }
      if (pFVar22->_oneof_case_[0] == 5) {
        pAVar24 = (ArrayFeatureType *)(pFVar22->Type_).int64type_;
      }
      else {
        pAVar24 = Specification::ArrayFeatureType::default_instance();
      }
      pFVar22 = pTVar21->type_;
      if (pFVar22 == (FeatureType *)0x0) {
        pFVar22 = (FeatureType *)&Specification::_FeatureType_default_instance_;
      }
      iVar36 = (pAVar24->shape_).current_size_;
      if (pFVar22->_oneof_case_[0] == 5) {
        pAVar24 = (ArrayFeatureType *)(pFVar22->Type_).int64type_;
      }
      else {
        pAVar24 = Specification::ArrayFeatureType::default_instance();
      }
      sVar25 = validate<(MLModelType)610>::anon_class_1_0_00000001::operator()
                         ((anon_class_1_0_00000001 *)pAVar24,pAVar31);
      bVar14 = iVar36 == 0;
      bVar38 = sVar25 != 0;
      bVar39 = iVar36 == 2;
      bVar40 = sVar25 != 2;
      if ((!bVar14 && !bVar39 || bVar38) && (bVar40 || !bVar14)) {
        local_228.int64type_ = (Int64FeatureType *)local_218;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_228,
                   "If shape information is provided for confidence output, 2 dimensions must be specified using either shape (deprecated) or allowedShapes."
                   ,"");
        Result::Result((Result *)local_2a8,INVALID_MODEL_PARAMETERS,(string *)&local_228);
LAB_00509aec:
        pTVar35 = local_2a8;
        local_40._M_allocated_capacity = local_218[0]._M_allocated_capacity;
        local_50[0] = local_228;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228.int64type_ == local_218) goto LAB_00509206;
LAB_00509b05:
        operator_delete(local_50[0].int64type_,local_40._M_allocated_capacity + 1);
        pTVar35 = local_2a8;
        goto LAB_00509206;
      }
      if (bVar39 && !bVar38) {
        pFVar22 = pTVar21->type_;
        if (pFVar22 == (FeatureType *)0x0) {
          pFVar22 = (FeatureType *)&Specification::_FeatureType_default_instance_;
        }
        if (pFVar22->_oneof_case_[0] == 5) {
          pAVar31 = (pFVar22->Type_).multiarraytype_;
        }
        else {
          pAVar31 = Specification::ArrayFeatureType::default_instance();
        }
        plVar26 = google::protobuf::RepeatedField<long>::Get(&pAVar31->shape_,0);
        pFVar22 = local_248->type_;
        if (pFVar22 == (FeatureType *)0x0) {
          pFVar22 = (FeatureType *)&Specification::_FeatureType_default_instance_;
        }
        lVar29 = *plVar26;
        if (pFVar22->_oneof_case_[0] == 5) {
          pAVar31 = (pFVar22->Type_).multiarraytype_;
        }
        else {
          pAVar31 = Specification::ArrayFeatureType::default_instance();
        }
        plVar26 = google::protobuf::RepeatedField<long>::Get(&pAVar31->shape_,0);
        if (lVar29 != *plVar26) {
          local_228.int64type_ = (Int64FeatureType *)local_218;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_228,
                     "Confidence and coordinates output shapes must be consistent (must have the same size along dimension 0)."
                     ,"");
          Result::Result((Result *)local_2a8,INVALID_MODEL_PARAMETERS,(string *)&local_228);
          goto LAB_00509aec;
        }
      }
      if (!bVar40 && bVar14) {
        pFVar22 = pTVar21->type_;
        if (pFVar22 == (FeatureType *)0x0) {
          pFVar22 = (FeatureType *)&Specification::_FeatureType_default_instance_;
        }
        if (pFVar22->_oneof_case_[0] == 5) {
          pAVar31 = (pFVar22->Type_).multiarraytype_;
        }
        else {
          pAVar31 = Specification::ArrayFeatureType::default_instance();
        }
        pFVar22 = local_248->type_;
        if (pFVar22 == (FeatureType *)0x0) {
          pFVar22 = (FeatureType *)&Specification::_FeatureType_default_instance_;
        }
        uVar2 = pAVar31->_oneof_case_[0];
        if (pFVar22->_oneof_case_[0] == 5) {
          pAVar31 = (pFVar22->Type_).multiarraytype_;
        }
        else {
          pAVar31 = Specification::ArrayFeatureType::default_instance();
        }
        if ((uVar2 == 0x1f) && (pAVar31->_oneof_case_[0] == 0x1f)) {
          pFVar22 = pTVar21->type_;
          if (pFVar22 == (FeatureType *)0x0) {
            pFVar22 = (FeatureType *)&Specification::_FeatureType_default_instance_;
          }
          if (pFVar22->_oneof_case_[0] == 5) {
            pAVar31 = (pFVar22->Type_).multiarraytype_;
          }
          else {
            pAVar31 = Specification::ArrayFeatureType::default_instance();
          }
          if (pAVar31->_oneof_case_[0] == 0x1f) {
            pAVar32 = (pAVar31->ShapeFlexibility_).enumeratedshapes_;
          }
          else {
            pAVar32 = (ArrayFeatureType_EnumeratedShapes *)
                      Specification::ArrayFeatureType_ShapeRange::default_instance();
          }
          pFVar22 = pTVar21->type_;
          if (pFVar22 == (FeatureType *)0x0) {
            pFVar22 = (FeatureType *)&Specification::_FeatureType_default_instance_;
          }
          if (pFVar22->_oneof_case_[0] == 5) {
            pAVar31 = (pFVar22->Type_).multiarraytype_;
          }
          else {
            pAVar31 = Specification::ArrayFeatureType::default_instance();
          }
          if (pAVar31->_oneof_case_[0] == 0x1f) {
            pAVar27 = (pAVar31->ShapeFlexibility_).enumeratedshapes_;
          }
          else {
            pAVar27 = (ArrayFeatureType_EnumeratedShapes *)
                      Specification::ArrayFeatureType_ShapeRange::default_instance();
          }
          pTVar28 = google::protobuf::internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::TypeHandler>
                              (&(pAVar32->shapes_).super_RepeatedPtrFieldBase,0);
          uVar7 = pTVar28->lowerbound_;
          pTVar28 = google::protobuf::internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::TypeHandler>
                              (&(pAVar27->shapes_).super_RepeatedPtrFieldBase,0);
          if (uVar7 == pTVar28->lowerbound_) {
            pTVar28 = google::protobuf::internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::TypeHandler>
                                (&(pAVar32->shapes_).super_RepeatedPtrFieldBase,0);
            lVar29 = pTVar28->upperbound_;
            pTVar28 = google::protobuf::internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::TypeHandler>
                                (&(pAVar27->shapes_).super_RepeatedPtrFieldBase,0);
            if (lVar29 == pTVar28->upperbound_) goto LAB_00509fec;
          }
          local_228.int64type_ = (Int64FeatureType *)local_218;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_228,
                     "Confidence and coordinates output shapes must be consistent (must have the same range of sizes along dimension 0)."
                     ,"");
          Result::Result((Result *)local_2a8,INVALID_MODEL_PARAMETERS,(string *)&local_228);
        }
        else {
          local_228.int64type_ = (Int64FeatureType *)local_218;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_228,
                     "Confidence and coordinates output shapes fexibility must both be ranges","");
          Result::Result((Result *)local_2a8,INVALID_MODEL_PARAMETERS,(string *)&local_228);
        }
        goto LAB_00509aec;
      }
LAB_00509fec:
      if ((local_2a0.supportvectorclassifier_)->_proba_cached_byte_size_ == 100) {
        lVar29 = 0x18;
LAB_0050a00c:
        uVar37 = *(uint *)((long)&(((ClassLabelsUnion *)
                                   &(local_2a0.itemsimilarityrecommender_)->itemstringids_)->
                                   stringclasslabels_->super_MessageLite)._vptr_MessageLite + lVar29
                          );
      }
      else {
        lVar29 = 0x10;
        uVar37 = 0;
        if ((local_2a0.supportvectorclassifier_)->_proba_cached_byte_size_ == 0x65)
        goto LAB_0050a00c;
      }
      if ((bVar39 && !bVar38) && 0 < (int)uVar37) {
        pFVar22 = pTVar21->type_;
        if (pFVar22 == (FeatureType *)0x0) {
          pFVar22 = (FeatureType *)&Specification::_FeatureType_default_instance_;
        }
        if (pFVar22->_oneof_case_[0] == 5) {
          pAVar31 = (pFVar22->Type_).multiarraytype_;
        }
        else {
          pAVar31 = Specification::ArrayFeatureType::default_instance();
        }
        puVar30 = (ulong *)google::protobuf::RepeatedField<long>::Get(&pAVar31->shape_,1);
        if (*puVar30 == (ulong)uVar37) goto LAB_0050a0a2;
        std::__cxx11::to_string((string *)local_50,uVar37);
        std::operator+(&local_98,"Number of classes is not consistent for class labels (",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50
                      );
        plVar26 = (long *)std::__cxx11::string::append((char *)&local_98);
        paVar33 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar26 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar26 == paVar33) {
          local_288._M_allocated_capacity = paVar33->_M_allocated_capacity;
          local_288._8_8_ = plVar26[3];
          local_298.int64type_ = (Int64FeatureType *)&local_288;
        }
        else {
          local_288._M_allocated_capacity = paVar33->_M_allocated_capacity;
          local_298.int64type_ = (Int64FeatureType *)*plVar26;
        }
        local_290 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar26[1];
        *plVar26 = (long)paVar33;
        plVar26[1] = 0;
        *(undefined1 *)(plVar26 + 2) = 0;
        pFVar22 = pTVar21->type_;
        if (pFVar22 == (FeatureType *)0x0) {
          pFVar22 = (FeatureType *)&Specification::_FeatureType_default_instance_;
        }
        if (pFVar22->_oneof_case_[0] == 5) {
          pAVar31 = (pFVar22->Type_).multiarraytype_;
        }
        else {
          pAVar31 = Specification::ArrayFeatureType::default_instance();
        }
        plVar26 = google::protobuf::RepeatedField<long>::Get(&pAVar31->shape_,1);
        std::__cxx11::to_string(&local_70,*plVar26);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_2c8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_298,&local_70);
        plVar26 = (long *)std::__cxx11::string::append((char *)&local_2c8);
        paVar33 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar26 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar26 == paVar33) {
          local_218[0]._0_8_ = paVar33->_M_allocated_capacity;
          local_218[0]._8_8_ = plVar26[3];
          local_228.int64type_ = (Int64FeatureType *)local_218;
        }
        else {
          local_218[0]._0_8_ = paVar33->_M_allocated_capacity;
          local_228.int64type_ = (Int64FeatureType *)*plVar26;
        }
        local_220 = (char *)plVar26[1];
        *plVar26 = (long)paVar33;
        plVar26[1] = 0;
        *(undefined1 *)(plVar26 + 2) = 0;
        Result::Result((Result *)local_2a8,INVALID_MODEL_PARAMETERS,(string *)&local_228);
        if (local_228.int64type_ != (Int64FeatureType *)local_218) {
          operator_delete(local_228.int64type_,local_218[0]._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c8.int64type_ != &local_2b8) {
          operator_delete(local_2c8.int64type_,local_2b8._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        if (local_298.int64type_ != (Int64FeatureType *)&local_288) {
          operator_delete(local_298.int64type_,local_288._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        pTVar35 = local_2a8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50[0].int64type_ == &local_40) goto LAB_00509206;
        goto LAB_00509b05;
      }
LAB_0050a0a2:
      if ((!bVar40 && bVar14) && 0 < (int)uVar37) {
        pFVar22 = pTVar21->type_;
        if (pFVar22 == (FeatureType *)0x0) {
          pFVar22 = (FeatureType *)&Specification::_FeatureType_default_instance_;
        }
        if (pFVar22->_oneof_case_[0] == 5) {
          pAVar31 = (pFVar22->Type_).multiarraytype_;
        }
        else {
          pAVar31 = Specification::ArrayFeatureType::default_instance();
        }
        if (pAVar31->_oneof_case_[0] == 0x1f) {
          pAVar32 = (pAVar31->ShapeFlexibility_).enumeratedshapes_;
        }
        else {
          pAVar32 = (ArrayFeatureType_EnumeratedShapes *)
                    Specification::ArrayFeatureType_ShapeRange::default_instance();
        }
        this_01 = &pAVar32->shapes_;
        pTVar28 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::TypeHandler>
                            (&this_01->super_RepeatedPtrFieldBase,1);
        if (((ulong)uVar37 < pTVar28->lowerbound_) ||
           ((pTVar28 = google::protobuf::internal::RepeatedPtrFieldBase::
                       Get<google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::TypeHandler>
                                 (&this_01->super_RepeatedPtrFieldBase,1), -1 < pTVar28->upperbound_
            && (pTVar28 = google::protobuf::internal::RepeatedPtrFieldBase::
                          Get<google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::TypeHandler>
                                    (&this_01->super_RepeatedPtrFieldBase,1),
               pTVar28->upperbound_ < (long)(ulong)uVar37)))) {
          std::__cxx11::to_string((string *)&local_298,uVar37);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_2c8,"Number of classes is not consistent for class labels (",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_298);
          plVar26 = (long *)std::__cxx11::string::append((char *)&local_2c8);
          paVar33 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar26 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar26 == paVar33) {
            local_218[0]._0_8_ = paVar33->_M_allocated_capacity;
            local_218[0]._8_8_ = plVar26[3];
            local_228.int64type_ = (Int64FeatureType *)local_218;
          }
          else {
            local_218[0]._0_8_ = paVar33->_M_allocated_capacity;
            local_228.int64type_ = (Int64FeatureType *)*plVar26;
          }
          local_220 = (char *)plVar26[1];
          *plVar26 = (long)paVar33;
          plVar26[1] = 0;
          *(undefined1 *)(plVar26 + 2) = 0;
          Result::Result((Result *)local_2a8,INVALID_MODEL_PARAMETERS,(string *)&local_228);
          if (local_228.int64type_ != (Int64FeatureType *)local_218) {
            operator_delete(local_228.int64type_,local_218[0]._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c8.int64type_ != &local_2b8) {
            operator_delete(local_2c8.int64type_,local_2b8._M_allocated_capacity + 1);
          }
          pTVar35 = local_2a8;
          local_40._M_allocated_capacity = local_288._M_allocated_capacity;
          local_50[0] = local_298;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_298.int64type_ == &local_288) goto LAB_00509206;
          goto LAB_00509b05;
        }
      }
      *local_2a8 = local_270;
      local_2a8[1].int64type_ = (Int64FeatureType *)(local_2a8 + 3);
      pTVar35 = local_2a8;
      if (local_268 == &local_258) {
        TVar11._1_7_ = local_258._M_allocated_capacity._1_7_;
        TVar11._0_1_ = local_258._M_local_buf[0];
        local_2a8[3] = TVar11;
        local_2a8[4] = (TypeUnion)local_258._8_8_;
      }
      else {
        local_2a8[1].int64type_ = (Int64FeatureType *)local_268;
        TVar10._1_7_ = local_258._M_allocated_capacity._1_7_;
        TVar10._0_1_ = local_258._M_local_buf[0];
        local_2a8[3] = TVar10;
      }
      goto LAB_005091ef;
    }
    local_228.int64type_ = (Int64FeatureType *)local_218;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_228,"iouThreshold must be a value between 0.0 and 1.0.","");
    Result::Result((Result *)pTVar35,INVALID_MODEL_PARAMETERS,(string *)&local_228);
LAB_005093cd:
    local_2b8._M_allocated_capacity = local_218[0]._M_allocated_capacity;
    local_2c8 = local_228;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228.int64type_ == local_218) goto LAB_00509206;
  }
  operator_delete(local_2c8.int64type_,local_2b8._M_allocated_capacity + 1);
LAB_00509206:
  if (local_268 != &local_258) {
    operator_delete(local_268,
                    CONCAT71(local_258._M_allocated_capacity._1_7_,local_258._M_local_buf[0]) + 1);
  }
  return (Result *)pTVar35;
}

Assistant:

Result validate<MLModelType_nonMaximumSuppression>(const Specification::Model& format) {
        const auto& description = format.description();
        const auto& nms = format.nonmaximumsuppression();
        
        //const auto& _confidenceInputFeatureName = nms.confidenceinputfeaturename();
        const auto& inputs = description.input();
        const auto& outputs = description.output();
        
        // Convenience typedefs
        typedef Specification::FeatureType FT;
        typedef Specification::Imputer::ReplaceValueCase RVC;
        
        Result result;
        
        // Validate it's an MLModel type
        result = validateModelDescription(description, format.specificationversion());
        if (!result.good()) {
            return result;
        }
        
        int confidenceInputIndex = -1;
        int coordinatesInputIndex = -1;
        int iouThresholdInputIndex = -1;
        int confidenceThresholdInputIndex = -1;
        
        // Make sure each input corresponds a feature name
        for (int i = 0; i < inputs.size(); ++i) {
            const std::string& name = inputs[i].name();
            bool used = false;
            
            if (nms.confidenceinputfeaturename().compare(name) == 0) {
                confidenceInputIndex = i;
                used = true;
            }
            
            if (nms.coordinatesinputfeaturename().compare(name) == 0) {
                coordinatesInputIndex = i;
                used = true;
            }
            
            if (nms.iouthresholdinputfeaturename().compare(name) == 0) {
                iouThresholdInputIndex = i;
                used = true;
            }
            
            if (nms.confidencethresholdinputfeaturename().compare(name) == 0) {
                confidenceThresholdInputIndex = i;
                used = true;
            }
            
            // The input was never used
            if (!used) {
                return Result(ResultType::TOO_MANY_FEATURES_FOR_MODEL_TYPE,
                              "Input feature '" + name + "' was not requested by any of the input feature names (e.g. confidenceInputFeatureName).");
            }
        }
        
        if (confidenceInputIndex == -1) {
            return Result(ResultType::INTERFACE_FEATURE_NAME_MISMATCH,
                          "Expected feature '" + nms.confidenceinputfeaturename() + "' (as defined by confidenceInputFeatureName) to the model is not present in the model description.");
        }
        
        if (coordinatesInputIndex == -1) {
            return Result(ResultType::INTERFACE_FEATURE_NAME_MISMATCH,
                          "Expected feature '" + nms.coordinatesinputfeaturename() + "' (as defined by coordinatesInputFeatureName) to the model is not present in the model description.");
        }
        
        int confidenceOutputIndex = -1;
        int coordinatesOutputIndex = -1;
        
        for (int i = 0; i < outputs.size(); ++i) {
            const std::string& name = outputs[i].name();
            bool used = false;
            
            if (nms.confidenceoutputfeaturename().compare(name) == 0) {
                confidenceOutputIndex = i;
                used = true;
            }
            
            if (nms.coordinatesoutputfeaturename().compare(name) == 0) {
                coordinatesOutputIndex = i;
                used = true;
            }
            
            // The output was never used
            if (!used) {
                return Result(ResultType::TOO_MANY_FEATURES_FOR_MODEL_TYPE,
                              "Output feature '" + name + "' was not requested by any of the output feature names (e.g. confidenceOutputFeatureName).");
            }
        }
        
        if (confidenceOutputIndex == -1) {
            return Result(ResultType::INTERFACE_FEATURE_NAME_MISMATCH,
                          "Expected feature '" + nms.confidenceoutputfeaturename() + "' (as defined by confidenceOutputFeatureName) from the model is not present in the model description.");
        }
        
        if (coordinatesOutputIndex == -1) {
            return Result(ResultType::INTERFACE_FEATURE_NAME_MISMATCH,
                          "Expected feature '" + nms.coordinatesoutputfeaturename() + "' (as defined by coordinatesOutputFeatureName) from the model is not present in the model description.");
        }
        
        // Validate the inputs
        result = validateDescriptionsContainFeatureWithNameAndType(description.input(),
                                                                   nms.confidenceinputfeaturename(),
                                                                   {FT::kMultiArrayType});
        if (!result.good()) {
            return result;
        }
        
        result = validateDescriptionsContainFeatureWithNameAndType(description.input(),
                                                                   nms.coordinatesinputfeaturename(),
                                                                   {FT::kMultiArrayType});
        if (!result.good()) {
            return result;
        }
        
        // Validate the optional inputs
        if (iouThresholdInputIndex >= 0) {
            result = validateDescriptionsContainFeatureWithNameAndType(description.input(),
                                                                       nms.iouthresholdinputfeaturename(),
                                                                       {FT::kDoubleType});
            if (!result.good()) {
                return result;
            }
        }
        
        
        if (confidenceThresholdInputIndex >= 0) {
            result = validateDescriptionsContainFeatureWithNameAndType(description.input(),
                                                                       nms.confidencethresholdinputfeaturename(),
                                                                       {FT::kDoubleType});
            if (!result.good()) {
                return result;
            }
        }
        
        // Validate the outputs
        result = validateDescriptionsContainFeatureWithNameAndType(description.output(),
                                                                   nms.confidenceoutputfeaturename(),
                                                                   {FT::kMultiArrayType});
        if (!result.good()) {
            return result;
        }
        
        result = validateDescriptionsContainFeatureWithNameAndType(description.output(),
                                                                   nms.coordinatesoutputfeaturename(),
                                                                   {FT::kMultiArrayType});
        if (!result.good()) {
            return result;
        }
        
        if (!(nms.iouthreshold() >= 0.0 && nms.iouthreshold() <= 1.0)) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "iouThreshold must be a value between 0.0 and 1.0.");
            
        }
        
        // Confidence can be greater than 1.0 if the user chooses to have non-probabilistic confidences.
        // However, since 0.0 is considered no confidence and used as a filler value when output shape
        // is larger than number of suppressed predictions, non-negative values are not allowed.
        if (!(nms.confidencethreshold() >= 0.0)) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "confidenceThreshold must be a non-negative value. If you do not want to eliminate any predictions based on confidence, set it to 0.0.");
            
        }
        
        // Make sure the input and output type match.
        // From the above, we know that we have exactly one input and one output type.
        const auto& confidence_in = description.input()[confidenceInputIndex];
        const auto& coordinates_in = description.input()[coordinatesInputIndex];
        const auto& confidence_out = description.output()[confidenceOutputIndex];
        const auto& coordinates_out = description.output()[coordinatesOutputIndex];

        const auto confidence_in_type = confidence_in.type().multiarraytype().datatype();
        const auto confidence_out_type = confidence_out.type().multiarraytype().datatype();
        const auto coordinates_in_type = coordinates_in.type().multiarraytype().datatype();
        const auto coordinates_out_type = coordinates_out.type().multiarraytype().datatype();

        if (confidence_in_type != confidence_out_type ||
            confidence_in_type != coordinates_in_type ||
            confidence_in_type != coordinates_out_type) {
            std::stringstream ss;
            ss << "'confidence' and 'coordinates' must use a same element type, but ";
            ss << "'input confidence' is " <<  FeatureType(confidence_in.type()).toString() << ", ";
            ss << "'output confidence' is " <<  FeatureType(confidence_out.type()).toString() << ", ";
            ss << "'input coordinates' are " <<  FeatureType(coordinates_in.type()).toString() << ", ";
            ss << "and 'output coordinates' are " <<  FeatureType(coordinates_out.type()).toString() << ".";

            return Result(ResultType::INVALID_MODEL_PARAMETERS, ss.str());
        }

        if (format.specificationversion() >= MLMODEL_SPECIFICATION_VERSION_IOS14) {
            if (confidence_in_type != Specification::ArrayFeatureType_ArrayDataType_DOUBLE &&
                confidence_in_type != Specification::ArrayFeatureType_ArrayDataType_FLOAT32) {
                std::stringstream ss;
                ss << "The element data type of 'confidence' and 'coordinates' must be either MultiArray<DOUBLE> or MultiArray<FLOAT32>, but ";
                ss << "'input confidence' is " <<  FeatureType(confidence_in.type()).toString() << ", ";
                ss << "'output confidence' is " <<  FeatureType(confidence_out.type()).toString() << ", ";
                ss << "'input coordinates' are " <<  FeatureType(coordinates_in.type()).toString() << ", ";
                ss << "and 'output coordinates' are " <<  FeatureType(coordinates_out.type()).toString() << ".";

                return Result(ResultType::INVALID_MODEL_PARAMETERS, ss.str());
            }
        } else {
            if (confidence_in_type != Specification::ArrayFeatureType_ArrayDataType_DOUBLE) {
                std::stringstream ss;
                ss << "The element data type of 'confidence' and 'coordinates' must be MultiArray<DOUBLE> for model specification version earlier than " << MLMODEL_SPECIFICATION_VERSION_IOS14 << ", but ";
                ss << "'input confidence' is " <<  FeatureType(confidence_in.type()).toString() << ", ";
                ss << "'output confidence' is " <<  FeatureType(confidence_out.type()).toString() << ", ";
                ss << "'input coordinates' are " <<  FeatureType(coordinates_in.type()).toString() << ", ";
                ss << "and 'output coordinates' are " <<  FeatureType(coordinates_out.type()).toString() << ". ";
                ss << "To enable MultiArray<FLOAT32>, use the model specification version " << MLMODEL_SPECIFICATION_VERSION_IOS14 << " or later.";

                return Result(ResultType::INVALID_MODEL_PARAMETERS, ss.str());
            }
        }

        auto rankOfFlexibleShape = [] (const CoreML::Specification::ArrayFeatureType &marray) -> size_t {
            switch (marray.ShapeFlexibility_case()) {
                case CoreML::Specification::ArrayFeatureType::kEnumeratedShapes:
                    return marray.enumeratedshapes().shapes(0).shape_size();
                case CoreML::Specification::ArrayFeatureType::kShapeRange:
                    return marray.shaperange().sizeranges_size();
                case CoreML::Specification::ArrayFeatureType::SHAPEFLEXIBILITY_NOT_SET:
                    return 0;
            }
        };

        auto hasFlexibleShape  = [] (const CoreML::Specification::ArrayFeatureType &marray) -> size_t {
            return marray.ShapeFlexibility_case() !=  CoreML::Specification::ArrayFeatureType::SHAPEFLEXIBILITY_NOT_SET;
        };

        auto hasEnumeratedShapes = [] (const CoreML::Specification::ArrayFeatureType &marray) -> size_t {
            return marray.ShapeFlexibility_case() ==  CoreML::Specification::ArrayFeatureType::kEnumeratedShapes;
        };

        auto hasShapeRange = [] (const CoreML::Specification::ArrayFeatureType &marray) -> size_t {
            return marray.ShapeFlexibility_case() ==  CoreML::Specification::ArrayFeatureType::kShapeRange;
        };

        
        size_t confOldShapeDim = confidence_out.type().multiarraytype().shape_size();
        size_t confNewShapeDim = rankOfFlexibleShape(confidence_out.type().multiarraytype());

        // These three options are all allowed, anything else will fail
        bool confUnspecified = (confOldShapeDim == 0 && confNewShapeDim == 0);
        bool confUseOld = (confOldShapeDim == 2 && confNewShapeDim == 0);
        bool confUseNew = (confOldShapeDim == 0 && confNewShapeDim == 2);

        if (!(confUnspecified || confUseOld || confUseNew)) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "If shape information is provided for confidence output, 2 dimensions must be specified using either shape (deprecated) or allowedShapes.");
        }

        bool coordsUnspecified = (confOldShapeDim == 0 && confNewShapeDim == 0);
        bool coordsUseOld = (confOldShapeDim == 2 && confNewShapeDim == 0);
        bool coordsUseNew = (confOldShapeDim == 0 && confNewShapeDim == 2);
        
        if (!(coordsUnspecified || coordsUseOld || coordsUseNew)) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "If shape information is provided for coordinates output, 2 dimensions must be specified using either shape (deprecated) or allowedShapes.");
        }
        
        // For now, require consistent usage of new/old
        if ((confUseOld && !coordsUseOld) || (confUseNew && !coordsUseNew)) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "Confidence and coordinates cannot use a mix of shape (deprecated) and allowedShapes.");
        }
        
        // If both use old shape, make sure shapes are consistent
        if (confUseOld && coordsUseOld &&
            confidence_out.type().multiarraytype().shape(0) != coordinates_out.type().multiarraytype().shape(0)) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "Confidence and coordinates output shapes must be consistent (must have the same size along dimension 0).");
        }
        
        // If both use new shape, make sure shapes are consistent
        if (confUseNew && coordsUseNew) {
            bool confIsRange = hasShapeRange(confidence_out.type().multiarraytype());
            bool coordsIsRange = hasShapeRange(coordinates_out.type().multiarraytype());

            // Only allow range flexibility
            if (!confIsRange || !coordsIsRange) {
                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                              "Confidence and coordinates output shapes fexibility must both be ranges");
            }

            // Check they have the same range across dimension 0
            const auto &confRange = confidence_out.type().multiarraytype().shaperange().sizeranges();
            const auto &coordRange = confidence_out.type().multiarraytype().shaperange().sizeranges();

            if (confRange[0].lowerbound() != coordRange[0].lowerbound() ||
                confRange[0].upperbound() != coordRange[0].upperbound()) {

                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                              "Confidence and coordinates output shapes must be consistent (must have the same range of sizes along dimension 0).");
            }
            
        }
        
        // If shape constraints on number of classes are defined, it must be consistent with
        // the number of labels.
        int numLabelNames;
        switch (nms.ClassLabels_case()) {
            case Specification::NonMaximumSuppression::kInt64ClassLabels:
                numLabelNames = nms.int64classlabels().vector_size();
                break;
            case Specification::NonMaximumSuppression::kStringClassLabels:
                numLabelNames = nms.stringclasslabels().vector_size();
                break;
            case Specification::NonMaximumSuppression::CLASSLABELS_NOT_SET:
                numLabelNames = 0;
                break;
        }
        
        if (confUseOld && numLabelNames > 0 &&
            confidence_out.type().multiarraytype().shape(1) != numLabelNames) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "Number of classes is not consistent for class labels (" + std::to_string(numLabelNames) + ") and dimension 1 of output confidence shape (" + std::to_string(confidence_out.type().multiarraytype().shape(1)) + ")");
        }
        
        if (confUseNew && numLabelNames > 0) {
            // Already checked confUseNew is a range above
            // Just check the range is correct

            const auto &confRange = confidence_out.type().multiarraytype().shaperange().sizeranges();

            if ((numLabelNames < confRange[1].lowerbound() ||
                  (confRange[1].upperbound() >= 0  && numLabelNames > confRange[1].upperbound()))) {
                      return Result(ResultType::INVALID_MODEL_PARAMETERS,
                                    "Number of classes is not consistent for class labels (" + std::to_string(numLabelNames) + ") and dimension 1 of output confidence shape range");
            }
        }

        return result;
    }